

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group.cxx
# Opt level: O0

int * __thiscall Fl_Group::sizes(Fl_Group *this)

{
  Fl_Widget *this_00;
  undefined1 auVar1 [16];
  Fl_Group **ppFVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int *piVar7;
  Fl_Group *this_01;
  Fl_Widget *o;
  Fl_Widget **ppFStack_30;
  int i;
  Fl_Widget **a;
  int t;
  Fl_Widget *r;
  int *p;
  Fl_Group *this_local;
  
  if (this->sizes_ == (int *)0x0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)((this->children_ + 2) * 4);
    uVar6 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    piVar7 = (int *)operator_new__(uVar6);
    this->sizes_ = piVar7;
    bVar3 = Fl_Widget::type(&this->super_Fl_Widget);
    if (bVar3 < 0xf0) {
      iVar4 = Fl_Widget::x(&this->super_Fl_Widget);
      *piVar7 = iVar4;
      iVar4 = Fl_Widget::y(&this->super_Fl_Widget);
      piVar7[2] = iVar4;
    }
    else {
      piVar7[2] = 0;
      *piVar7 = 0;
    }
    iVar4 = *piVar7;
    iVar5 = Fl_Widget::w(&this->super_Fl_Widget);
    piVar7[1] = iVar4 + iVar5;
    iVar4 = piVar7[2];
    iVar5 = Fl_Widget::h(&this->super_Fl_Widget);
    piVar7[3] = iVar4 + iVar5;
    piVar7[4] = *piVar7;
    piVar7[5] = piVar7[1];
    piVar7[6] = piVar7[2];
    piVar7[7] = piVar7[3];
    this_01 = (Fl_Group *)resizable(this);
    if ((this_01 != (Fl_Group *)0x0) && (this_01 != this)) {
      iVar4 = Fl_Widget::x((Fl_Widget *)this_01);
      if (*piVar7 < iVar4) {
        piVar7[4] = iVar4;
      }
      iVar5 = Fl_Widget::w((Fl_Widget *)this_01);
      if (iVar5 + iVar4 < piVar7[1]) {
        piVar7[5] = iVar5 + iVar4;
      }
      iVar4 = Fl_Widget::y((Fl_Widget *)this_01);
      if (piVar7[2] < iVar4) {
        piVar7[6] = iVar4;
      }
      iVar5 = Fl_Widget::h((Fl_Widget *)this_01);
      if (iVar5 + iVar4 < piVar7[3]) {
        piVar7[7] = iVar5 + iVar4;
      }
    }
    r = (Fl_Widget *)(piVar7 + 8);
    ppFStack_30 = array(this);
    o._4_4_ = this->children_;
    while (o._4_4_ != 0) {
      this_00 = *ppFStack_30;
      iVar4 = Fl_Widget::x(this_00);
      *(int *)&r->_vptr_Fl_Widget = iVar4;
      iVar4 = Fl_Widget::x(this_00);
      iVar5 = Fl_Widget::w(this_00);
      *(int *)((long)&r->_vptr_Fl_Widget + 4) = iVar4 + iVar5;
      iVar4 = Fl_Widget::y(this_00);
      ppFVar2 = &r->parent_;
      *(int *)&r->parent_ = iVar4;
      iVar4 = Fl_Widget::y(this_00);
      iVar5 = Fl_Widget::h(this_00);
      r = (Fl_Widget *)&r->callback_;
      *(int *)((long)ppFVar2 + 4) = iVar4 + iVar5;
      o._4_4_ = o._4_4_ + -1;
      ppFStack_30 = ppFStack_30 + 1;
    }
  }
  return this->sizes_;
}

Assistant:

int* Fl_Group::sizes() {
  if (!sizes_) {
    int* p = sizes_ = new int[4*(children_+2)];
    // first thing in sizes array is the group's size:
    if (type() < FL_WINDOW) {p[0] = x(); p[2] = y();} else {p[0] = p[2] = 0;}
    p[1] = p[0]+w(); p[3] = p[2]+h();
    // next is the resizable's size:
    p[4] = p[0]; // init to the group's size
    p[5] = p[1];
    p[6] = p[2];
    p[7] = p[3];
    Fl_Widget* r = resizable();
    if (r && r != this) { // then clip the resizable to it
      int t;
      t = r->x(); if (t > p[0]) p[4] = t;
      t +=r->w(); if (t < p[1]) p[5] = t;
      t = r->y(); if (t > p[2]) p[6] = t;
      t +=r->h(); if (t < p[3]) p[7] = t;
    }
    // next is all the children's sizes:
    p += 8;
    Fl_Widget*const* a = array();
    for (int i=children_; i--;) {
      Fl_Widget* o = *a++;
      *p++ = o->x();
      *p++ = o->x()+o->w();
      *p++ = o->y();
      *p++ = o->y()+o->h();
    }
  }
  return sizes_;
}